

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R10_Decoder.cc
# Opt level: O3

Array_Data_Symbol * __thiscall
R10_Decoder::Indecoding_phase_4
          (Array_Data_Symbol *__return_storage_ptr__,R10_Decoder *this,
          matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
          *A,Array_Data_Symbol *D,uint32_t *M)

{
  double dVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  size_type sVar9;
  size_type sVar10;
  Array_Data_Symbol *pAVar11;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pmVar12;
  reference puVar13;
  referred_type *prVar14;
  uint uVar15;
  uint uVar16;
  referred_type *prVar17;
  int i;
  matrix_closure_type mVar18;
  size_type sVar19;
  uint32_t r;
  int iVar20;
  R10_Decoder *pRVar21;
  pointer psVar22;
  pointer psVar23;
  pointer pVVar24;
  referred_type *prVar25;
  matrix_closure_type mVar26;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  for_xor;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  group_col;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  U_upper;
  referred_type *local_2b8;
  pointer local_2b0;
  matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_2a8;
  R10_Decoder *local_280;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_278;
  Array_Data_Symbol *local_270;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_268;
  referred_type *local_250;
  pointer local_248;
  referred_type *local_240;
  size_type local_238;
  undefined1 local_230 [24];
  referred_type *local_218;
  referred_type *local_210;
  referred_type *local_208;
  referred_type *local_200;
  referred_type *local_1f8;
  pointer local_1f0;
  referred_type *local_1e8;
  long local_1e0;
  pointer local_1d8;
  Utility *local_1d0;
  basic_range<unsigned_long,_long> local_1c8;
  size_type sStack_1b8;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  *local_1a8;
  referred_type *local_1a0;
  referred_type *local_198;
  matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_190;
  basic_range<unsigned_long,_long> local_168;
  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  local_150 [8];
  ulong local_148;
  void *local_140;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_138;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *local_f0;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *local_e8;
  pointer pvStack_e0;
  vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  local_90 [8];
  pointer local_88;
  pointer local_80;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  Array_Data_Symbol::Array_Data_Symbol(__return_storage_ptr__);
  dVar1 = ceil((double)this->A_u * 0.125);
  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
            ((basic_range<unsigned_long,_long> *)local_230,0,(ulong)this->A_i);
  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
            ((basic_range<unsigned_long,_long> *)&local_268,(ulong)this->A_i,(ulong)D->L);
  boost::numeric::ublas::
  matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::matrix_range(&local_2a8,A,(range_type *)local_230,(range_type *)&local_268);
  boost::numeric::ublas::
  matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
  ::
  matrix<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
            ((matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_190,
             (matrix_expression<boost::numeric::ublas::matrix_range<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              *)&local_2a8);
  local_230._8_8_ = (Inter_Symbol_Generator *)0x8;
  local_230._16_8_ = operator_new(8);
  uVar15 = (int)(long)dVar1 - 1;
  local_1f0 = (pointer)(ulong)uVar15;
  prVar14 = (referred_type *)local_190.size1_;
  local_280 = this;
  local_270 = D;
  local_1a8 = A;
  if (uVar15 == 0) {
    psVar23 = (pointer)0x0;
    mVar18.e_ = (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)0x0;
  }
  else {
    local_210 = &(this->precomput_param).U_p;
    local_1d0 = &this->util;
    local_1e8 = (referred_type *)(ulong)uVar15;
    local_208 = (referred_type *)0x0;
    uVar15 = 0;
    mVar18.e_ = (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)0x0;
    psVar23 = (pointer)0x0;
    prVar17 = (referred_type *)local_190.size1_;
    do {
      local_1f8 = (referred_type *)(ulong)uVar15;
      if (prVar17 == (referred_type *)0x0) {
        prVar17 = (referred_type *)0x0;
      }
      else {
        local_1e0 = (long)local_1f8 << 5;
        uVar15 = (int)local_208 * 0xff;
        local_1d8 = (pointer)(ulong)uVar15;
        local_218 = (referred_type *)((long)local_208 * 8);
        local_238 = (long)local_208 * 8 + 8;
        local_240 = (referred_type *)(ulong)(uVar15 + 0xff);
        local_250 = (referred_type *)0x0;
        local_2b8 = mVar18.e_;
        local_2b0 = psVar23;
        do {
          boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                    ((basic_range<unsigned_long,_long> *)&local_268,(size_type)local_218,local_238);
          local_2a8.data_.e_ = &local_190;
          local_2a8.r1_.start_ = (size_type)local_250;
          local_2a8.r1_.size_ =
               (size_type)
               local_268.
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_2a8.r2_.start_ =
               (size_type)
               local_268.
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          boost::numeric::ublas::
          vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
          ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                       *)local_230,
                      (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       *)&local_2a8);
          boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
          unbounded_array(&local_48,
                          (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                          local_230);
          uVar15 = local_230._8_4_ - 1;
          sVar19 = 0;
          iVar20 = 0;
          do {
            puVar13 = boost::numeric::ublas::
                      unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                (&local_48,sVar19);
            iVar20 = iVar20 + (uint)(*puVar13 == '\x01');
            sVar19 = sVar19 + 1;
          } while ((uint)sVar19 <= uVar15);
          if (local_48.size_ != 0) {
            operator_delete(local_48.data_,local_48.size_);
          }
          mVar18.e_ = local_2b8;
          psVar23 = local_2b0;
          if (iVar20 != 0) {
            pRVar21 = (R10_Decoder *)local_230;
            boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
            unbounded_array(&local_60,
                            (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                            pRVar21);
            find_nonZeros_pos_In_Row
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,pRVar21,
                       (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)&local_60,0,local_230._8_4_ - 1);
            psVar23 = (pointer)local_2a8.r1_.size_;
            mVar18.e_ = local_2a8.data_.e_;
            local_200 = (referred_type *)local_2a8.r1_.start_;
            local_2a8.data_.e_ =
                 (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)0x0;
            local_2a8.r1_.start_ = 0;
            local_2a8.r1_.size_ = 0;
            if ((local_2b8 !=
                 (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)0x0) &&
               (operator_delete(local_2b8,(long)local_2b0 - (long)local_2b8),
               local_2a8.data_.e_ !=
               (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)0x0)) {
              operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_);
            }
            if (local_60.size_ != 0) {
              operator_delete(local_60.data_,local_60.size_);
            }
            if ((uint)local_1d8 < 0xffffff01) {
              local_248 = psVar23;
              local_278 = mVar18.e_;
              local_200 = (long)local_200 - mVar18.e_;
              local_2b0 = (pointer)local_1e0;
              prVar14 = local_1f8;
              psVar22 = (pointer)0x0;
              mVar18.e_ = (referred_type *)0x0;
              do {
                pRVar21 = (R10_Decoder *)local_230;
                boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                          ((basic_range<unsigned_long,_long> *)&local_268,(size_type)local_218,
                           local_238);
                local_2a8.data_.e_ = local_210;
                local_2a8.r1_.size_ =
                     (size_type)
                     local_268.
                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                local_2a8.r2_.start_ =
                     (size_type)
                     local_268.
                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                local_2a8.r1_.start_ = (size_type)prVar14;
                boost::numeric::ublas::
                vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                             *)pRVar21,
                            (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                             *)&local_2a8);
                boost::numeric::ublas::
                unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::unbounded_array
                          (&local_78,
                           (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)pRVar21
                          );
                find_nonZeros_pos_In_Row
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,pRVar21
                           ,(vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                             *)&local_78,0,7);
                sVar10 = local_2a8.r1_.size_;
                sVar9 = local_2a8.r1_.start_;
                mVar26.e_ = local_2a8.data_.e_;
                local_2a8.data_.e_ =
                     (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)0x0;
                local_2a8.r1_.start_ = 0;
                local_2a8.r1_.size_ = 0;
                if ((mVar18.e_ != (referred_type *)0x0) &&
                   (operator_delete(mVar18.e_,(long)psVar22 - (long)mVar18.e_),
                   local_2a8.data_.e_ !=
                   (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)0x0)) {
                  operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_)
                  ;
                }
                if ((pointer)local_78.size_ != (pointer)0x0) {
                  operator_delete(local_78.data_,local_78.size_);
                }
                if ((sVar9 - mVar26.e_ == local_200) &&
                   (((referred_type *)sVar9 == mVar26.e_ ||
                    (iVar20 = bcmp(mVar26.e_,local_278,(size_t)local_200), iVar20 == 0)))) {
                  pmVar12 = local_1a8;
                  local_2a8.data_.e_ = local_1a8;
                  local_2a8.r1_.start_ = (size_type)local_250;
                  boost::numeric::ublas::
                  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                            ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                              *)&local_268,
                             (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              *)&local_2a8);
                  pAVar11 = local_270;
                  pRVar21 = local_280;
                  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                            (&local_1c8,(ulong)local_280->A_i,(ulong)local_270->L);
                  local_f0 = &local_268;
                  local_e8 = (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                              *)local_1c8.start_;
                  pvStack_e0 = (pointer)local_1c8.size_;
                  boost::numeric::ublas::
                  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  vector<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                            ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                              *)&local_d8,
                             (vector_expression<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                              *)&local_f0);
                  local_1a0 = local_210;
                  local_198 = prVar14;
                  boost::numeric::ublas::
                  vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                  ::
                  vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                            (local_90,(vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                       *)&local_1a0);
                  Utility::matrix_row_XOR
                            ((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&local_2a8,local_1d0,&local_d8,
                             (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)local_90);
                  boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                            (&local_168,(ulong)pRVar21->A_i,(ulong)pAVar11->L);
                  local_1c8.start_ = (size_type)&local_268;
                  local_1c8.size_ = local_168.start_;
                  sStack_1b8 = local_168.size_;
                  boost::numeric::ublas::
                  vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                  ::operator=((vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                               *)&local_1c8,
                              (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_2a8);
                  if ((referred_type *)local_2a8.r1_.start_ != (referred_type *)0x0) {
                    operator_delete((void *)local_2a8.r1_.size_,local_2a8.r1_.start_);
                  }
                  if (local_88 != (pointer)0x0) {
                    operator_delete(local_80,(ulong)local_88);
                  }
                  if (local_d8.data_.size_ != 0) {
                    operator_delete(local_d8.data_.data_,local_d8.data_.size_);
                  }
                  prVar17 = local_250;
                  local_2a8.data_.e_ = pmVar12;
                  local_2a8.r1_.start_ = (size_type)local_250;
                  boost::numeric::ublas::
                  matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                  ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                               *)&local_2a8,
                              (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                               *)&local_268);
                  Vector_Data_DEF::operator^
                            ((Vector_Data_DEF *)&local_2a8,
                             (pAVar11->symbol).
                             super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                             (pRVar21->d).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[(long)prVar17],
                             (Vector_Data_DEF *)
                             ((long)&(((pRVar21->precomput_param).D_p.symbol.
                                       super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->s).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl + (long)local_2b0));
                  pVVar24 = (pAVar11->symbol).
                            super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                            (pRVar21->d).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[(long)prVar17];
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                            (&pVVar24->s,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8);
                  pVVar24->d_len = (uint32_t)local_2a8.r2_.start_;
                  Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)&local_2a8);
                  if (local_268.
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                    operator_delete(local_268.
                                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    (ulong)local_268.
                                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                  }
                }
                psVar23 = local_248;
                prVar14 = (referred_type *)((long)&prVar14->size1_ + 1);
                local_2b0 = (pointer)((long)local_2b0 + 0x20);
                psVar22 = (pointer)sVar10;
                mVar18.e_ = mVar26.e_;
              } while (prVar14 < local_240);
              mVar18.e_ = local_278;
              if (mVar26.e_ != (referred_type *)0x0) {
                operator_delete(mVar26.e_,sVar10 - (long)mVar26.e_);
                mVar18.e_ = local_278;
              }
            }
          }
          local_250 = (referred_type *)
                      ((long)&((matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&local_250->size1_)->size1_ + 1);
          prVar14 = (referred_type *)local_190.size1_;
          prVar17 = (referred_type *)local_190.size1_;
          D = local_270;
          this = local_280;
          local_2b8 = mVar18.e_;
          local_2b0 = psVar23;
        } while (local_250 < local_190.size1_);
      }
      local_208 = (referred_type *)((long)&local_208->size1_ + 1);
      uVar15 = (int)local_1f8 + 0xff;
    } while (local_208 != local_1e8);
  }
  if (prVar14 != (referred_type *)0x0) {
    iVar20 = (int)local_1f0;
    uVar15 = iVar20 * 0xff;
    local_1d8 = (pointer)(ulong)uVar15;
    local_238 = (size_type)(uint)(iVar20 * 8);
    local_250 = (referred_type *)(ulong)(iVar20 * 8 + 8);
    local_1f8 = (referred_type *)CONCAT44(local_1f8._4_4_,uVar15 - 1);
    local_1e0 = CONCAT44(local_1e0._4_4_,uVar15 + 0xff);
    local_218 = &(this->precomput_param).U_p;
    local_1d0 = &this->util;
    local_208 = (referred_type *)(ulong)uVar15;
    local_1e8 = (referred_type *)((long)local_208 << 5);
    local_1f0 = (pointer)CONCAT44(local_1f0._4_4_,iVar20 * -0xff);
    local_240 = (referred_type *)0x0;
    local_2b8 = mVar18.e_;
    local_2b0 = psVar23;
    do {
      uVar15 = this->A_u & 7;
      if (uVar15 == 0) {
        boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                  ((basic_range<unsigned_long,_long> *)&local_268,local_238,(size_type)local_250);
        local_2a8.data_.e_ = &local_190;
        local_2a8.r1_.start_ = (size_type)local_240;
        local_2a8.r1_.size_ =
             (size_type)
             local_268.
             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2a8.r2_.start_ =
             (size_type)
             local_268.
             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        boost::numeric::ublas::
        vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
        ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                     *)local_230,
                    (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     *)&local_2a8);
      }
      else {
        boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                  ((basic_range<unsigned_long,_long> *)&local_268,local_238,
                   (ulong)(uVar15 | (uint)local_238));
        local_2a8.data_.e_ = &local_190;
        local_2a8.r1_.start_ = (size_type)local_240;
        local_2a8.r1_.size_ =
             (size_type)
             local_268.
             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2a8.r2_.start_ =
             (size_type)
             local_268.
             super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        boost::numeric::ublas::
        vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
        ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                     *)local_230,
                    (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     *)&local_2a8);
      }
      boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
      unbounded_array(&local_108,
                      (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)local_230);
      uVar15 = local_230._8_4_ - 1;
      sVar19 = 0;
      iVar20 = 0;
      do {
        puVar13 = boost::numeric::ublas::
                  unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                            (&local_108,sVar19);
        iVar20 = iVar20 + (uint)(*puVar13 == '\x01');
        sVar19 = sVar19 + 1;
      } while ((uint)sVar19 <= uVar15);
      if ((_Base_ptr)local_108.size_ != (_Base_ptr)0x0) {
        operator_delete(local_108.data_,local_108.size_);
      }
      mVar18.e_ = local_2b8;
      D = local_270;
      this = local_280;
      psVar23 = local_2b0;
      if (iVar20 != 0) {
        pRVar21 = (R10_Decoder *)local_230;
        boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>::
        unbounded_array(&local_a8,
                        (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)pRVar21);
        this = local_280;
        find_nonZeros_pos_In_Row
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,pRVar21,
                   (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_a8,0,local_230._8_4_ - 1);
        psVar23 = (pointer)local_2a8.r1_.size_;
        mVar18.e_ = local_2a8.data_.e_;
        local_210 = (referred_type *)local_2a8.r1_.start_;
        local_2a8.data_.e_ =
             (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0;
        local_2a8.r1_.start_ = 0;
        local_2a8.r1_.size_ = 0;
        if ((local_2b8 !=
             (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)0x0) &&
           (operator_delete(local_2b8,(long)local_2b0 - (long)local_2b8),
           local_2a8.data_.e_ !=
           (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)0x0)) {
          operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_);
        }
        if (local_a8.size_ != 0) {
          operator_delete(local_a8.data_,local_a8.size_);
        }
        uVar16 = this->A_u & 7;
        uVar15 = (1 << (sbyte)uVar16) + (int)local_1f8;
        if (uVar16 == 0) {
          uVar15 = (uint)local_1e0;
        }
        D = local_270;
        if ((uint)local_1d8 < uVar15) {
          local_248 = psVar23;
          local_278 = mVar18.e_;
          local_210 = (long)local_210 - mVar18.e_;
          iVar20 = uVar15 + (int)local_1f0;
          local_2b0 = (pointer)0x0;
          local_2b8 = (referred_type *)0x0;
          prVar14 = local_1e8;
          prVar17 = local_208;
          do {
            local_200 = (referred_type *)CONCAT44(local_200._4_4_,iVar20);
            uVar15 = local_280->A_u & 7;
            if (uVar15 == 0) {
              boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                        ((basic_range<unsigned_long,_long> *)&local_268,local_238,
                         (size_type)local_250);
              local_2a8.data_.e_ = local_218;
              local_2a8.r1_.size_ =
                   (size_type)
                   local_268.
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_2a8.r2_.start_ =
                   (size_type)
                   local_268.
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_2a8.r1_.start_ = (size_type)prVar17;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                           *)local_230,
                          (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                           *)&local_2a8);
            }
            else {
              boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                        ((basic_range<unsigned_long,_long> *)&local_268,local_238,
                         (ulong)(uVar15 | (uint)local_238));
              local_2a8.data_.e_ = local_218;
              local_2a8.r1_.size_ =
                   (size_type)
                   local_268.
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_2a8.r2_.start_ =
                   (size_type)
                   local_268.
                   super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              local_2a8.r1_.start_ = (size_type)prVar17;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::operator=((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                           *)local_230,
                          (vector_expression<boost::numeric::ublas::vector_range<const_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                           *)&local_2a8);
            }
            if ((local_280->A_u & 7) == 0) {
              pRVar21 = (R10_Decoder *)local_230;
              boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>
              ::unbounded_array(&local_c0,
                                (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                                pRVar21);
              find_nonZeros_pos_In_Row
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,pRVar21,
                         (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&local_c0,0,7);
              sVar9 = local_2a8.r1_.size_;
              prVar25 = (referred_type *)local_2a8.r1_.start_;
              mVar26.e_ = local_2a8.data_.e_;
              local_2a8.data_.e_ =
                   (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)0x0;
              local_2a8.r1_.start_ = 0;
              local_2a8.r1_.size_ = 0;
              if ((local_2b8 != (referred_type *)0x0) &&
                 (operator_delete(local_2b8,(long)local_2b0 - (long)local_2b8),
                 local_2a8.data_.e_ !=
                 (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)0x0)) {
                operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_);
              }
              if (local_c0.size_ != 0) {
                operator_delete(local_c0.data_,local_c0.size_);
              }
              local_2b0 = (pointer)sVar9;
            }
            else {
              pRVar21 = (R10_Decoder *)local_230;
              boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>
              ::unbounded_array(&local_120,
                                (unbounded_array<unsigned_char,_std::allocator<unsigned_char>_> *)
                                pRVar21);
              find_nonZeros_pos_In_Row
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_2a8,pRVar21,
                         (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&local_120,0,(local_280->A_u & 7) - 1);
              sVar9 = local_2a8.r1_.size_;
              prVar25 = (referred_type *)local_2a8.r1_.start_;
              mVar26.e_ = local_2a8.data_.e_;
              local_2a8.data_.e_ =
                   (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)0x0;
              local_2a8.r1_.start_ = 0;
              local_2a8.r1_.size_ = 0;
              if ((local_2b8 != (referred_type *)0x0) &&
                 (operator_delete(local_2b8,(long)local_2b0 - (long)local_2b8),
                 local_2a8.data_.e_ !=
                 (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)0x0)) {
                operator_delete(local_2a8.data_.e_,local_2a8.r1_.size_ - (long)local_2a8.data_.e_);
              }
              if (local_120.size_ != 0) {
                operator_delete(local_120.data_,local_120.size_);
              }
              local_2b0 = (pointer)sVar9;
            }
            if (((long)prVar25 - mVar26.e_ == local_210) &&
               ((prVar25 == mVar26.e_ ||
                (iVar20 = bcmp(mVar26.e_,local_278,(size_t)local_210), iVar20 == 0)))) {
              pmVar12 = local_1a8;
              prVar25 = local_240;
              local_2a8.data_.e_ = local_1a8;
              local_2a8.r1_.start_ = (size_type)local_240;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::
              vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                        ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                          *)&local_268,
                         (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&local_2a8);
              boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                        (&local_1c8,(ulong)local_280->A_i,(ulong)local_270->L);
              local_f0 = &local_268;
              local_e8 = (vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                          *)local_1c8.start_;
              pvStack_e0 = (pointer)local_1c8.size_;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::
              vector<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                        ((vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
                          *)&local_138,
                         (vector_expression<boost::numeric::ublas::vector_range<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&local_f0);
              local_1a0 = local_218;
              local_198 = prVar17;
              boost::numeric::ublas::
              vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>
              ::
              vector<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>>
                        (local_150,
                         (vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                          *)&local_1a0);
              Utility::matrix_row_XOR
                        ((vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)&local_2a8,local_1d0,&local_138,
                         (vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_150);
              boost::numeric::ublas::basic_range<unsigned_long,_long>::basic_range
                        (&local_168,(ulong)local_280->A_i,(ulong)local_270->L);
              local_1c8.start_ = (size_type)&local_268;
              local_1c8.size_ = local_168.start_;
              sStack_1b8 = local_168.size_;
              boost::numeric::ublas::
              vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
              ::operator=((vector_range<boost::numeric::ublas::vector<unsigned_char,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_1c8,
                          (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&local_2a8);
              if ((referred_type *)local_2a8.r1_.start_ != (referred_type *)0x0) {
                operator_delete((void *)local_2a8.r1_.size_,local_2a8.r1_.start_);
              }
              if (local_148 != 0) {
                operator_delete(local_140,local_148);
              }
              if (local_138.data_.size_ != 0) {
                operator_delete(local_138.data_.data_,local_138.data_.size_);
              }
              local_2a8.data_.e_ = pmVar12;
              local_2a8.r1_.start_ = (size_type)prVar25;
              boost::numeric::ublas::
              matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
              ::operator=((matrix_row<boost::numeric::ublas::matrix<unsigned_char,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_2a8,
                          (vector_expression<boost::numeric::ublas::vector<unsigned_char,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)&local_268);
              pAVar11 = local_270;
              pRVar21 = local_280;
              Vector_Data_DEF::operator^
                        ((Vector_Data_DEF *)&local_2a8,
                         (local_270->symbol).
                         super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                         _M_impl.super__Vector_impl_data._M_start +
                         (local_280->d).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)prVar25],
                         (Vector_Data_DEF *)
                         ((long)&prVar14->size1_ +
                         (long)(local_280->precomput_param).D_p.symbol.
                               super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>
                               ._M_impl.super__Vector_impl_data._M_start));
              pVVar24 = (pAVar11->symbol).
                        super__Vector_base<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                        (pRVar21->d).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)prVar25];
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                        (&pVVar24->s,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_2a8);
              pVVar24->d_len = (uint32_t)local_2a8.r2_.start_;
              Vector_Data_DEF::~Vector_Data_DEF((Vector_Data_DEF *)&local_2a8);
              if (local_268.
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
                operator_delete(local_268.
                                super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (ulong)local_268.
                                       super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
              }
            }
            psVar23 = local_248;
            D = local_270;
            prVar17 = (referred_type *)((long)&prVar17->size1_ + 1);
            prVar14 = (referred_type *)&(prVar14->data_).data_;
            iVar20 = (int)local_200 + -1;
            local_2b8 = mVar26.e_;
          } while (iVar20 != 0);
          mVar18.e_ = local_278;
          this = local_280;
          if (mVar26.e_ != (referred_type *)0x0) {
            operator_delete(mVar26.e_,(long)local_2b0 - (long)mVar26.e_);
            mVar18.e_ = local_278;
            this = local_280;
          }
        }
      }
      local_240 = (referred_type *)
                  ((long)&((matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)&local_240->size1_)->size1_ + 1);
      local_2b8 = mVar18.e_;
      local_2b0 = psVar23;
    } while (local_240 < local_190.size1_);
  }
  uVar5 = D->sym_len;
  uVar6 = D->X;
  uVar7 = D->S;
  uVar8 = D->H;
  uVar2 = D->L;
  uVar3 = D->LP;
  uVar4 = D->K;
  __return_storage_ptr__->HP = D->HP;
  __return_storage_ptr__->L = uVar2;
  __return_storage_ptr__->LP = uVar3;
  __return_storage_ptr__->K = uVar4;
  __return_storage_ptr__->sym_len = uVar5;
  __return_storage_ptr__->X = uVar6;
  __return_storage_ptr__->S = uVar7;
  __return_storage_ptr__->H = uVar8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&__return_storage_ptr__->ESIs,&D->ESIs);
  std::vector<Vector_Data_DEF,_std::allocator<Vector_Data_DEF>_>::operator=
            (&__return_storage_ptr__->symbol,&D->symbol);
  uVar5 = D->_K;
  uVar6 = D->_X;
  uVar7 = D->_S;
  uVar8 = D->_H;
  uVar2 = D->_L;
  uVar3 = D->_LP;
  uVar4 = D->_sym_len;
  __return_storage_ptr__->_HP = D->_HP;
  __return_storage_ptr__->_L = uVar2;
  __return_storage_ptr__->_LP = uVar3;
  __return_storage_ptr__->_sym_len = uVar4;
  __return_storage_ptr__->_K = uVar5;
  __return_storage_ptr__->_X = uVar6;
  __return_storage_ptr__->_S = uVar7;
  __return_storage_ptr__->_H = uVar8;
  if ((Inter_Symbol_Generator *)local_230._8_8_ != (Inter_Symbol_Generator *)0x0) {
    operator_delete((void *)local_230._16_8_,local_230._8_8_);
  }
  if (mVar18.e_ !=
      (matrix<unsigned_char,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<unsigned_char,_std::allocator<unsigned_char>_>_>
       *)0x0) {
    operator_delete(mVar18.e_,(long)psVar23 - (long)mVar18.e_);
  }
  if ((pointer)local_190.data_.size_ != (pointer)0x0) {
    operator_delete(local_190.data_.data_,local_190.data_.size_);
  }
  return __return_storage_ptr__;
}

Assistant:

class Array_Data_Symbol R10_Decoder::Indecoding_phase_4(matrix<uint8_t> &A, class Array_Data_Symbol &D,  uint32_t &M)
{

	/*
	For each of the first i rows of A, for each group of 8 columns in the
   U_upper submatrix of this row, if the set of 8 column entries in
   U_upper are not all zero, then the row of the precomputation matrix
   U' that matches the pattern in the 8 columns is exclusive-ORed into
   the row, thus zeroing out those 8 columns in the row at the cost of
   exclusive-ORing one row of U' into the row.
	
	*/

	class Array_Data_Symbol result;

	uint32_t groups_num = std::ceil(A_u / 8.0);

	uint32_t nonZeros = 0;

	ublas::matrix<uint8_t> U_upper =  ublas::project(A, range(0, A_i), range(A_i, D.L));

	std::vector<uint32_t> nonZeros_pos;
	nonZeros_pos.clear();

	ublas::vector<uint8_t> group_col(8);



	// for (int i = 0; i < U_upper.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < U_upper.size2(); j++)
	// 	{
	// 		printf("%d ",  U_upper(i, j));  
	// 	}
	// 	printf("\n");
	// }

	//groups_num = 1;
	uint32_t _row = 0;
	for (int i = 0; i < groups_num - 1; i++)
	{


		_row = i * 255;
		for (int j = 0; j < U_upper.size1(); j++)
		{

			group_col = ublas::project(ublas::row(U_upper, j), range(8 * i, 8 * i + 8));

			// for (int k = 0; k < group_col.size(); k++)
			// {
			// 	printf(" %d ", group_col(k));
			// }
			// std::cout << std::endl;
	

			nonZeros = nonZeros_In_Row(group_col, 0, group_col.size() - 1);
		//	std::cout << "U_upper nonZeros: " << nonZeros << std::endl;

			if (nonZeros == 0)
			{
				continue;
			}


		//	std::cout << "find_nonZeros_pos_In_Row: " << std::endl;

			nonZeros_pos = find_nonZeros_pos_In_Row(group_col, 0, group_col.size() - 1);

			// for (int k = 0; k < nonZeros_pos.size(); k++)
			// {
			// 	std::cout << "  " << nonZeros_pos[k];
			// }
			// std::cout << std::endl;


		//	std::cout << "match_pos: " << std::endl;
			std::vector<uint32_t> match_pos;
			//	printf(" %d \n", _row);
			uint32_t orig_row = _row;
			while(_row < 255 * (i + 1))
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * i, 8 * i + 8));

//				match_pos = find_nonZeros_pos_In_Row (ublas::row(precomput_param.U_p, _row), 8 * i, 8 * i + 8 - 1);
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, 8 - 1);
				


				// for (int k = 0; k < match_pos.size(); k++)
				// {
				// 	printf(" %d ", match_pos[k]);
				// }
				//std::cout << std::endl;

				if (match_pos == nonZeros_pos)
				{
			//		std::cout << "match_pos == nonZeros_pos" << std::endl;
					// for (int k = 0; k < nonZeros_pos.size(); k++)
					// {
					// 	std::cout << "  " << nonZeros_pos[k];
					// }
					// std::cout << std::endl;

					// for (int k = 0; k < match_pos.size(); k++)
					// {
					// 	printf(" %d ", match_pos[k]);
					// }
					// std::cout << std::endl;


					ublas::vector<uint8_t> for_xor = ublas::row(A, j);
					 ublas::subrange(for_xor, A_i, D.L) = util.matrix_row_XOR(ublas::subrange(for_xor, A_i, D.L), ublas::row(precomput_param.U_p, _row));
					 ublas::row(A, j) = for_xor;
					//exit(0);
					 D.symbol[d[j]] = D.symbol[d[j]] ^ precomput_param.D_p.symbol[_row];

				}
				// the _row can increase after matching.
				_row++;

			}
			_row = orig_row;


		//	std::cout << std::endl;
		}
		
	}

				


	// last group handle
	//std::cout << "last group handle: " << std::endl;


	_row = (groups_num - 1) * 255;
	for (int j = 0; j < U_upper.size1(); j++)
	{

		if (A_u % 8 == 0)
		{
			group_col = ublas::project(ublas::row(U_upper, j), range(8 * (groups_num - 1), 8 * (groups_num - 1) + 8));
		}
		else
		{
			group_col = ublas::project(ublas::row(U_upper, j), range(8 * (groups_num - 1), 8 * (groups_num - 1) + A_u % 8));
		}
		

		// for (int k = 0; k < group_col.size(); k++)
		// {
		// 	printf(" %d ", group_col(k));
		// }
		// std::cout << std::endl;
	



		nonZeros = nonZeros_In_Row(group_col, 0, group_col.size() - 1);
	//	std::cout << "U_upper nonZeros: " << nonZeros << std::endl;

		if (nonZeros == 0)
		{
			continue;
		}

			

	//	std::cout << "find_nonZeros_pos_In_Row: " << std::endl;

		nonZeros_pos = find_nonZeros_pos_In_Row(group_col, 0, group_col.size() - 1);

		// for (int k = 0; k < nonZeros_pos.size(); k++)
		// {
		// 	std::cout << " " << nonZeros_pos[k];
		// }
		// std::cout << std::endl;



	//	std::cout << "match_pos: " << std::endl;
		std::vector<uint32_t> match_pos;
		//	printf(" %d \n", _row);
		uint32_t orig_row = _row;


		uint32_t last_group_condition = 255 * (groups_num - 1) + (1 << A_u % 8) - 1;

		if (A_u % 8 == 0)
		{
			last_group_condition = 255 * (groups_num - 1) + 255;
		}

		uint32_t chosen_col = 0;

	//	std::cout << "last_group_condition: " << last_group_condition << std::endl;

		//while(_row < 255 * (groups_num - 1) + (1 << A_u % 8) - 1 )
		while(_row < last_group_condition)
		{





			if (A_u % 8 == 0)
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * (groups_num - 1), 8 *(groups_num - 1) + 8));
			}
			else
			{
				group_col = ublas::project(ublas::row(precomput_param.U_p, _row), range(8 * (groups_num - 1), 8 *(groups_num - 1) + A_u % 8));

			}


			//match_pos = find_nonZeros_pos_In_Row (ublas::row(precomput_param.U_p, _row), 8 * (groups_num - 1), 8 * (groups_num - 1) + A_u % 8 - 1);

			if (A_u % 8 == 0)
			{
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, 8 - 1);

			}
			else
			{
				match_pos = find_nonZeros_pos_In_Row (group_col, 0, A_u % 8 - 1);

			}


			// for (int k = 0; k < group_col.size(); k++)
			// {
			// 	printf(" %d ", group_col(k));
			// }
			// std::cout << std::endl;
	

				// for (int k = 0; k < precomput_param.U_p.size2(); k++)
				// {
				// 	printf(" %d ", precomput_param.U_p(_row,k));
					
				// }

				//std::cout << A_u % 8 - 1 << std::endl;


			// for (int k = 0; k < match_pos.size(); k++)
			// {
			// 	printf(" %d ", match_pos[k]);
			// }
			// std::cout << std::endl;




	//		std::cout << "_row: "<< _row << std::endl;

			if (match_pos == nonZeros_pos)
			{

				// std::cout << "match_pos == nonZeros_pos" << std::endl;


				// for (int k = 0; k < nonZeros_pos.size(); k++)
				// {
				// 	std::cout << "  " << nonZeros_pos[k];
				// }
				// std::cout << std::endl;

				// for (int k = 0; k < match_pos.size(); k++)
				// {
				// 	printf(" %d ", match_pos[k]);
				// }
				// std::cout << std::endl;


				ublas::vector<uint8_t> for_xor = ublas::row(A, j);
				 ublas::subrange(for_xor, A_i, D.L) = util.matrix_row_XOR(ublas::subrange(for_xor, A_i, D.L), ublas::row(precomput_param.U_p, _row));
					 ublas::row(A, j) = for_xor;
				
				D.symbol[d[j]] = D.symbol[d[j]] ^ precomput_param.D_p.symbol[_row];

				

			}
			_row++;


		}
		_row = orig_row;


//		std::cout << std::endl;
	}

	// for (int i = 0; i < precomput_param.U_p.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < precomput_param.U_p.size2(); j++)
	// 	{
	// 		printf("%d ",  precomput_param.U_p(i, j));  
	// 	}
	// 	printf("\n");
	// }	


	// for (int i = 0; i < A.size1(); i++)
	// {
	// 	printf("%2d: ", i);
	// 	for (int j = 0; j < A.size2(); j++)
	// 	{
	// 		printf("%d ",  A(i, j));  
	// 	}
	// 	printf("\n");
	// }	


	result = D;


	return result;
}